

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm_vecsmall::SmallVectorTemplateCommon<char_*,_void>::grow_pod
          (SmallVectorTemplateCommon<char_*,_void> *this,size_t MinSizeInBytes,size_t TSize)

{
  ulong uVar1;
  undefined1 *__src;
  void *__dest;
  size_t __n;
  
  __src = (undefined1 *)(this->super_SmallVectorBase).BeginX;
  __n = (long)(this->super_SmallVectorBase).EndX - (long)__src;
  uVar1 = TSize + ((long)(this->super_SmallVectorBase).CapacityX - (long)__src) * 2;
  if (MinSizeInBytes < uVar1) {
    MinSizeInBytes = uVar1;
  }
  if ((U *)__src == &this->FirstEl) {
    __dest = malloc(MinSizeInBytes);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = realloc(__src,MinSizeInBytes);
  }
  if (__dest != (void *)0x0) {
    (this->super_SmallVectorBase).EndX = (void *)(__n + (long)__dest);
    (this->super_SmallVectorBase).BeginX = __dest;
    (this->super_SmallVectorBase).CapacityX = (void *)(MinSizeInBytes + (long)__dest);
    return;
  }
  __assert_fail("NewElts && \"Out of memory\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/SmallVector/SmallVector.h"
                ,0x3c9,"void llvm_vecsmall::SmallVectorBase::grow_pod(void *, size_t, size_t)");
}

Assistant:

void grow_pod(size_t MinSizeInBytes, size_t TSize) {
    SmallVectorBase::grow_pod(&FirstEl, MinSizeInBytes, TSize);
  }